

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

bool wasm::canTurnIfIntoBrIf
               (Expression *ifCondition,Expression *brValue,PassOptions *options,Module *wasm)

{
  bool bVar1;
  EffectAnalyzer local_308;
  undefined4 local_1a8;
  undefined1 local_198 [8];
  EffectAnalyzer value;
  Module *wasm_local;
  PassOptions *options_local;
  Expression *brValue_local;
  Expression *ifCondition_local;
  
  value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  bVar1 = Type::operator==(&ifCondition->type,
                           (BasicType *)
                           ((long)&value.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count + 4));
  if (bVar1) {
    ifCondition_local._7_1_ = false;
  }
  else if (brValue == (Expression *)0x0) {
    ifCondition_local._7_1_ = true;
  }
  else {
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_198,options,wasm,brValue);
    bVar1 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_198);
    if (bVar1) {
      ifCondition_local._7_1_ = false;
    }
    else {
      EffectAnalyzer::EffectAnalyzer(&local_308,options,wasm,ifCondition);
      bVar1 = EffectAnalyzer::invalidates(&local_308,(EffectAnalyzer *)local_198);
      ifCondition_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      EffectAnalyzer::~EffectAnalyzer(&local_308);
    }
    local_1a8 = 1;
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_198);
  }
  return ifCondition_local._7_1_;
}

Assistant:

static bool canTurnIfIntoBrIf(Expression* ifCondition,
                              Expression* brValue,
                              PassOptions& options,
                              Module& wasm) {
  // if the if isn't even reached, this is all dead code anyhow
  if (ifCondition->type == Type::unreachable) {
    return false;
  }
  if (!brValue) {
    return true;
  }
  EffectAnalyzer value(options, wasm, brValue);
  if (value.hasSideEffects()) {
    return false;
  }
  return !EffectAnalyzer(options, wasm, ifCondition).invalidates(value);
}